

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.hpp
# Opt level: O3

Iterator __thiscall
Map<Callback::MemberFuncPtr,_Callback::Emitter::SignalData>::insert
          (Map<Callback::MemberFuncPtr,_Callback::Emitter::SignalData> *this,Item **cell,
          Item *parent,MemberFuncPtr *key,SignalData *value)

{
  Item *pIVar1;
  usize uVar2;
  code *pcVar3;
  undefined8 uVar4;
  int iVar5;
  ItemBlock *pIVar6;
  Item *pIVar7;
  Iterator *pIVar8;
  long lVar9;
  Item *pIVar10;
  
  while ((cell == &parent->right || (cell == &parent->left || parent == (Item *)0x0) ||
         (iVar5 = Debug::printf("%s:%u: assertion failed: %s\n",
                                "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/../include/nstd/Map.hpp"
                                ,0x188,"!parent || cell == &parent->left || cell == &parent->right")
         , iVar5 == 0))) {
    pIVar10 = *cell;
    if (pIVar10 == (Item *)0x0) {
      pIVar10 = this->freeItem;
      if (pIVar10 == (Item *)0x0) {
        pIVar6 = (ItemBlock *)operator_new__(0x2e8);
        pIVar6->next = this->blocks;
        this->blocks = pIVar6;
        pIVar6[0x17].next = (ItemBlock *)0x0;
        pIVar6[0x2e].next = pIVar6 + 1;
        pIVar6[0x45].next = pIVar6 + 0x18;
        pIVar6[0x5c].next = pIVar6 + 0x2f;
        pIVar10 = (Item *)(pIVar6 + 0x46);
        this->freeItem = pIVar10;
      }
      uVar4 = *(undefined8 *)&key->field_0x8;
      (pIVar10->key).ptr = key->ptr;
      *(undefined8 *)&(pIVar10->key).field_0x8 = uVar4;
      (pIVar10->value).activation = value->activation;
      List<Callback::Emitter::Slot>::List(&(pIVar10->value).slots,&value->slots);
      (pIVar10->value).dirty = value->dirty;
      pIVar10->parent = parent;
      pIVar10->left = (Item *)0x0;
      pIVar10->right = (Item *)0x0;
      pIVar10->height = 1;
      pIVar10->slope = 0;
      this->freeItem = pIVar10->prev;
      *cell = pIVar10;
      this->_size = this->_size + 1;
      if (parent != (Item *)0x0) {
        pIVar7 = parent;
        if (cell == &parent->right) {
          pIVar7 = parent->next;
        }
        pIVar1 = pIVar7->prev;
        pIVar8 = (Iterator *)&pIVar1->next;
        if (pIVar1 == (Item *)0x0) {
          pIVar8 = &this->_begin;
        }
        pIVar10->prev = pIVar1;
        pIVar8->item = pIVar10;
        pIVar10->next = pIVar7;
        pIVar7->prev = pIVar10;
        do {
          uVar2 = parent->height;
          Item::updateHeightAndSlope(parent);
          pIVar7 = rebal(this,parent);
          if (uVar2 == pIVar7->height) {
            return (Iterator)pIVar10;
          }
          parent = pIVar7->parent;
        } while (parent != (Item *)0x0);
        return (Iterator)pIVar10;
      }
      pIVar7 = (this->_begin).item;
      if (pIVar7 != &this->endItem) {
        iVar5 = Debug::printf("%s:%u: assertion failed: %s\n",
                              "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/../include/nstd/Map.hpp"
                              ,0x1a1,"_begin.item == &endItem");
        if (iVar5 != 0) break;
        pIVar7 = (this->_begin).item;
      }
      pIVar10->prev = (Item *)0x0;
      pIVar10->next = pIVar7;
      (this->_begin).item = pIVar10;
      (this->endItem).prev = pIVar10;
      return (Iterator)pIVar10;
    }
    iVar5 = Memory::compare(key,pIVar10,0x10);
    lVar9 = 0x90;
    if (iVar5 < 1) {
      iVar5 = Memory::compare(key,pIVar10,0x10);
      lVar9 = 0x88;
      if (-1 < iVar5) {
        (pIVar10->value).activation = value->activation;
        List<Callback::Emitter::Slot>::operator=(&(pIVar10->value).slots,&value->slots);
        (pIVar10->value).dirty = value->dirty;
        return (Iterator)pIVar10;
      }
    }
    cell = (Item **)((long)&(pIVar10->key).ptr + lVar9);
    parent = pIVar10;
  }
  pcVar3 = (code *)invalidInstructionException();
  (*pcVar3)();
}

Assistant:

Iterator insert(Item** cell, Item* parent, const T& key, const V& value)
  {
  begin:
    ASSERT(!parent || cell == &parent->left || cell == &parent->right);
    Item* position = *cell;
    if(!position)
    {
      Item* item = freeItem;
      if(!item)
      {
        ItemBlock* itemBlock = (ItemBlock*)new char[sizeof(ItemBlock) + sizeof(Item) * 4];
        itemBlock->next = blocks;
        blocks = itemBlock;
        for(Item* i = (Item*)(itemBlock + 1), * end = i + 4; i < end; ++i)
        {
          i->prev = item;
          item = i;
        }
        freeItem = item;
      }

      new(item) Item(parent, key, value);
      freeItem = item->prev;

      *cell = item;
      ++_size;
      if(!parent)
      { // first item
        ASSERT(_begin.item == &endItem);
        item->prev = 0;
        item->next = _begin.item;
        _begin.item = item;
        endItem.prev = item;
      }
      else
      {
        Item* insertPos = cell == &parent->right ? 
          parent->next : // insert after parent
          parent; // insert before parent
        if((item->prev = insertPos->prev))
          insertPos->prev->next = item;
        else
          _begin.item = item;
        item->next = insertPos;
        insertPos->prev = item;

        // neu:
        usize oldHeight;
        do
        {
          oldHeight = parent->height;
          parent->updateHeightAndSlope();
          parent = rebal(parent);
          if(oldHeight == parent->height)
            break;
          parent = parent->parent;
        } while(parent);
      }
      return item;
    }
    else
    {
      if(key > position->key)
      {
        cell = &position->right;
        parent = position;
        goto begin;
      }
      else if(key < position->key)
      {
        cell = &position->left;
        parent = position;
        goto begin;
      }
      else
      {
        position->value = value;
        return position;
      }
    }
  }